

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_affix_argument(vw *all,string *str)

{
  char cVar1;
  char *__dest;
  char *pcVar2;
  ulong uVar3;
  ostream *poVar4;
  vw_exception *pvVar5;
  char *pcVar6;
  ulong uVar7;
  string sStack_218;
  string local_1f8;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  if (str->_M_string_length == 0) {
    return;
  }
  __dest = calloc_or_throw<char>(str->_M_string_length + 1);
  strcpy(__dest,(str->_M_dataplus)._M_p);
  pcVar2 = strtok(__dest,",");
  while( true ) {
    if (pcVar2 == (char *)0x0) {
      free(__dest);
      return;
    }
    if (*pcVar2 == '-') {
      pcVar6 = pcVar2 + 1;
      uVar3 = 0;
    }
    else {
      uVar3 = 1;
      pcVar6 = pcVar2;
      if (*pcVar2 == '+') {
        pcVar6 = pcVar2 + 1;
      }
    }
    if ((byte)(*pcVar6 - 0x38U) < 0xf9) break;
    cVar1 = pcVar6[1];
    uVar7 = 0x20;
    if (cVar1 != '\0') {
      if ((cVar1 == ':') || (cVar1 == '|')) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        poVar4 = std::operator<<(&local_1a8,"malformed affix argument (invalid namespace): ");
        std::operator<<(poVar4,pcVar2);
        pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                   ,0x143,&local_1f8);
        __cxa_throw(pvVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (pcVar6[2] != '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        poVar4 = std::operator<<(&local_1a8,"malformed affix argument (too long): ");
        std::operator<<(poVar4,pcVar2);
        pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                   ,0x146,&sStack_218);
        __cxa_throw(pvVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      uVar7 = (ulong)cVar1;
    }
    all->affix_features[uVar7 & 0xffff] =
         all->affix_features[uVar7 & 0xffff] << 4 | uVar3 | (byte)(*pcVar6 * '\x02' + 0xa0);
    pcVar2 = strtok((char *)0x0,",");
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  poVar4 = std::operator<<(&local_1a8,"malformed affix argument (length must be 1..7): ");
  std::operator<<(poVar4,pcVar2);
  pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
             ,0x13a,&local_1d8);
  __cxa_throw(pvVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void parse_affix_argument(vw& all, string str)
{
  if (str.length() == 0)
    return;
  char* cstr = calloc_or_throw<char>(str.length() + 1);
  strcpy(cstr, str.c_str());

  char* p = strtok(cstr, ",");

  try
  {
    while (p != 0)
    {
      char* q = p;
      uint16_t prefix = 1;
      if (q[0] == '+')
      {
        q++;
      }
      else if (q[0] == '-')
      {
        prefix = 0;
        q++;
      }
      if ((q[0] < '1') || (q[0] > '7'))
        THROW("malformed affix argument (length must be 1..7): " << p);

      uint16_t len = (uint16_t)(q[0] - '0');
      uint16_t ns = (uint16_t)' ';  // default namespace
      if (q[1] != 0)
      {
        if (valid_ns(q[1]))
          ns = (uint16_t)q[1];
        else
          THROW("malformed affix argument (invalid namespace): " << p);

        if (q[2] != 0)
          THROW("malformed affix argument (too long): " << p);
      }

      uint16_t afx = (len << 1) | (prefix & 0x1);
      all.affix_features[ns] <<= 4;
      all.affix_features[ns] |= afx;

      p = strtok(nullptr, ",");
    }
  }
  catch (...)
  {
    free(cstr);
    throw;
  }

  free(cstr);
}